

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzstrmatrixor.cpp
# Opt level: O1

void __thiscall
TPZStructMatrixOR<std::complex<double>_>::Assemble
          (TPZStructMatrixOR<std::complex<double>_> *this,TPZBaseMatrix *stiffness,
          TPZBaseMatrix *rhs,TPZAutoPointer<TPZGuiInterface> *guiInterface)

{
  TPZReference *pTVar1;
  long lVar2;
  complex<double> *__s;
  ulong uVar3;
  TPZAutoPointer<TPZGuiInterface> *pTVar4;
  long lVar5;
  TPZAutoPointer<TPZGuiInterface> local_f0;
  TPZAutoPointer<TPZGuiInterface> local_e8;
  long local_e0;
  long local_d8;
  TPZAutoPointer<TPZGuiInterface> local_d0;
  TPZAutoPointer<TPZGuiInterface> local_c8;
  TPZFMatrix<std::complex<double>_> local_c0;
  
  lVar2 = __dynamic_cast(this,&TPZStructMatrixOR<std::complex<double>>::typeinfo,
                         &TPZStructMatrix::typeinfo,0xfffffffffffffffe);
  if (ass_stiff.filename.
      super_argT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>.
      super_arg_base.arg_set == true) {
    ass_stiff.stats_recorded = true;
    RunStatsRecorder::start(&ass_stiff.stats);
  }
  if (*(char *)(lVar2 + 0x58) == '\x01') {
    lVar5 = *(long *)(lVar2 + 0x70);
    local_c0.super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fRow = 0;
    local_c0.super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fCol = 0;
    local_c0.super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fDecomposed = '\0';
    local_c0.super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fDefPositive = '\0';
    local_c0.super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.super_TPZSavable.
    _vptr_TPZSavable = (_func_int **)&PTR__TPZFMatrix_01841760;
    local_c0.fElem = (complex<double> *)0x0;
    local_c0.fGiven = (complex<double> *)0x0;
    local_c0.fSize = 0;
    TPZVec<int>::TPZVec(&local_c0.fPivot.super_TPZVec<int>,0);
    local_c0.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8;
    local_c0.fPivot.super_TPZVec<int>.fStore = local_c0.fPivot.fExtAlloc;
    local_c0.fPivot.super_TPZVec<int>.fNElements = 0;
    local_c0.fPivot.super_TPZVec<int>.fNAlloc = 0;
    local_c0.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01840c80;
    local_c0.fWork.fStore = (complex<double> *)0x0;
    local_c0.fWork.fNElements = 0;
    local_c0.fWork.fNAlloc = 0;
    if ((&this->field_0xc)[*(long *)(*(long *)this + -0x60)] == '\x01') {
      local_d8 = rhs->fCol;
      uVar3 = local_d8 * lVar5;
      if (uVar3 - local_c0.super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fCol *
                  local_c0.super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fRow != 0) {
        local_e0 = lVar5;
        if ((local_c0.fElem != (complex<double> *)0x0) && (local_c0.fElem != local_c0.fGiven)) {
          operator_delete__(local_c0.fElem);
        }
        if ((local_c0.fGiven == (complex<double> *)0x0) ||
           (__s = local_c0.fGiven, uVar3 - local_c0.fSize != 0 && local_c0.fSize <= (long)uVar3)) {
          if (uVar3 == 0) {
            __s = (complex<double> *)0x0;
          }
          else {
            __s = (complex<double> *)operator_new__(-(ulong)(uVar3 >> 0x3c != 0) | uVar3 * 0x10);
            memset(__s,0,uVar3 * 0x10);
          }
        }
        lVar5 = local_e0;
        local_c0.fElem = __s;
        if (__s == (complex<double> *)0x0 && uVar3 != 0) {
          TPZFMatrix<std::complex<double>_>::Error("Resize <memory allocation error>.",(char *)0x0);
        }
      }
      local_c0.super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fCol = local_d8;
      local_c0.super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fRow = lVar5;
      (*local_c0.super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.super_TPZSavable.
        _vptr_TPZSavable[0xf])();
    }
    pTVar1 = guiInterface->fRef;
    if (*(int *)(&this->field_0x8 + *(long *)(*(long *)this + -0x60)) == 0) {
      pTVar4 = &local_d0;
      LOCK();
      (pTVar1->fCounter).super___atomic_base<int>._M_i =
           (pTVar1->fCounter).super___atomic_base<int>._M_i + 1;
      UNLOCK();
      local_d0.fRef = pTVar1;
      (**(code **)(*(long *)this + 0x58))(this,stiffness,&local_c0,pTVar4);
    }
    else {
      pTVar4 = &local_c8;
      LOCK();
      (pTVar1->fCounter).super___atomic_base<int>._M_i =
           (pTVar1->fCounter).super___atomic_base<int>._M_i + 1;
      UNLOCK();
      local_c8.fRef = pTVar1;
      (**(code **)(*(long *)this + 0x70))(this,stiffness,&local_c0,pTVar4);
    }
    TPZAutoPointer<TPZGuiInterface>::~TPZAutoPointer(pTVar4);
    if ((&this->field_0xc)[*(long *)(*(long *)this + -0x60)] == '\x01') {
      TPZEquationFilter::Scatter((TPZEquationFilter *)(lVar2 + 0x48),(TPZBaseMatrix *)&local_c0,rhs)
      ;
    }
    TPZFMatrix<std::complex<double>_>::~TPZFMatrix(&local_c0);
  }
  else {
    pTVar1 = guiInterface->fRef;
    if (*(int *)(&this->field_0x8 + *(long *)(*(long *)this + -0x60)) == 0) {
      LOCK();
      (pTVar1->fCounter).super___atomic_base<int>._M_i =
           (pTVar1->fCounter).super___atomic_base<int>._M_i + 1;
      UNLOCK();
      local_f0.fRef = pTVar1;
      (**(code **)(*(long *)this + 0x58))(this,stiffness,rhs);
      pTVar4 = &local_f0;
    }
    else {
      LOCK();
      (pTVar1->fCounter).super___atomic_base<int>._M_i =
           (pTVar1->fCounter).super___atomic_base<int>._M_i + 1;
      UNLOCK();
      local_e8.fRef = pTVar1;
      (**(code **)(*(long *)this + 0x70))(this,stiffness,rhs);
      pTVar4 = &local_e8;
    }
    TPZAutoPointer<TPZGuiInterface>::~TPZAutoPointer(pTVar4);
  }
  if (ass_stiff.filename.
      super_argT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>.
      super_arg_base.arg_set == true) {
    ass_stiff.stats_recorded = true;
    RunStatsRecorder::stop(&ass_stiff.stats);
  }
  return;
}

Assistant:

void 
TPZStructMatrixOR<TVar>::Assemble(TPZBaseMatrix & stiffness, TPZBaseMatrix & rhs, TPZAutoPointer<TPZGuiInterface> guiInterface) {
    const auto &equationFilter =
        (dynamic_cast<TPZStructMatrix*>(this))->EquationFilter();
    ass_stiff.start();
    if (equationFilter.IsActive()) {
        int64_t neqcondense = equationFilter.NActiveEquations();
#ifdef PZDEBUG
        if (stiffness.Rows() != neqcondense) {
            DebugStop();
        }
#endif
        TPZFMatrix<TVar> rhsloc;
        if(ComputeRhs()) rhsloc.Redim(neqcondense, rhs.Cols());
        if (this->fNumThreads) {
            this->MultiThread_Assemble(stiffness, rhsloc, guiInterface);
        } else {
            this->Serial_Assemble(stiffness, rhsloc, guiInterface);
        }

        if(ComputeRhs()) equationFilter.Scatter(rhsloc, rhs);
    } else {
        if (this->fNumThreads) {
            this->MultiThread_Assemble(stiffness, rhs, guiInterface);
        } else {
            this->Serial_Assemble(stiffness, rhs, guiInterface);
        }
    }
    ass_stiff.stop();
}